

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

void __thiscall wasm::RemoveNonJSOpsPass::visitUnary(RemoveNonJSOpsPass *this,Unary *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  IString str;
  IString str_00;
  IString str_01;
  IString str_02;
  IString str_03;
  IString str_04;
  pointer this_00;
  Call *expression;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar1;
  allocator<wasm::Expression_*> local_139;
  Expression *local_138;
  iterator local_130;
  size_type local_128;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_120;
  size_t local_108;
  char *pcStack_100;
  _Node_iterator_base<wasm::Name,_true> local_f8;
  undefined1 local_f0;
  size_t local_e8;
  char *local_e0;
  Name local_d8;
  size_t local_c8;
  char *local_c0;
  Name local_b8;
  size_t local_a8;
  char *local_a0;
  Name local_98;
  size_t local_88;
  char *local_80;
  Name local_78;
  size_t local_68;
  char *local_60;
  Name local_58;
  size_t local_48;
  char *local_40;
  Name local_38;
  undefined1 auStack_28 [8];
  Name functionCall;
  Unary *curr_local;
  RemoveNonJSOpsPass *this_local;
  
  functionCall.super_IString.str._M_str = (char *)curr;
  wasm::Name::Name((Name *)auStack_28);
  switch(*(undefined4 *)(functionCall.super_IString.str._M_str + 0x10)) {
  case 2:
    local_e8 = WASM_CTZ32;
    local_e0 = DAT_03192c08;
    str.str._M_str = DAT_03192c08;
    str.str._M_len = WASM_CTZ32;
    wasm::Name::Name(&local_d8,str);
    wasm::Name::operator=((Name *)auStack_28,&local_d8);
    break;
  case 3:
    local_c8 = WASM_CTZ64;
    local_c0 = DAT_03192c18;
    str_00.str._M_str = DAT_03192c18;
    str_00.str._M_len = WASM_CTZ64;
    wasm::Name::Name(&local_b8,str_00);
    wasm::Name::operator=((Name *)auStack_28,&local_b8);
    break;
  case 4:
    local_a8 = WASM_POPCNT32;
    local_a0 = DAT_03192c48;
    str_01.str._M_str = DAT_03192c48;
    str_01.str._M_len = WASM_POPCNT32;
    wasm::Name::Name(&local_98,str_01);
    wasm::Name::operator=((Name *)auStack_28,&local_98);
    break;
  case 5:
    local_88 = WASM_POPCNT64;
    local_80 = DAT_03192c58;
    str_02.str._M_str = DAT_03192c58;
    str_02.str._M_len = WASM_POPCNT64;
    wasm::Name::Name(&local_78,str_02);
    wasm::Name::operator=((Name *)auStack_28,&local_78);
    break;
  default:
    return;
  case 0x10:
    local_48 = WASM_NEAREST_F32;
    local_40 = DAT_03192ce8;
    str_04.str._M_str = DAT_03192ce8;
    str_04.str._M_len = WASM_NEAREST_F32;
    wasm::Name::Name(&local_38,str_04);
    wasm::Name::operator=((Name *)auStack_28,&local_38);
    break;
  case 0x11:
    local_68 = WASM_NEAREST_F64;
    local_60 = DAT_03192cf8;
    str_03.str._M_str = DAT_03192cf8;
    str_03.str._M_len = WASM_NEAREST_F64;
    wasm::Name::Name(&local_58,str_03);
    wasm::Name::operator=((Name *)auStack_28,&local_58);
  }
  pVar1 = std::
          unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
          ::insert(&this->neededIntrinsics,(value_type *)auStack_28);
  local_f8._M_cur = (__node_type *)pVar1.first.super__Node_iterator_base<wasm::Name,_true>._M_cur;
  local_f0 = pVar1.second;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  local_108 = (size_t)auStack_28;
  pcStack_100 = (char *)functionCall.super_IString.str._M_len;
  local_138 = *(Expression **)(functionCall.super_IString.str._M_str + 0x18);
  local_130 = &local_138;
  local_128 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_139);
  __l._M_len = local_128;
  __l._M_array = local_130;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_120,__l,&local_139);
  target.super_IString.str._M_str = pcStack_100;
  target.super_IString.str._M_len = local_108;
  expression = Builder::makeCall(this_00,target,&local_120,
                                 (Type)*(uintptr_t *)(functionCall.super_IString.str._M_str + 8),
                                 false);
  Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>_>
              ).
              super_PostWalker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
              .
              super_Walker<wasm::RemoveNonJSOpsPass,_wasm::Visitor<wasm::RemoveNonJSOpsPass,_void>_>
             ,(Expression *)expression);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_120);
  std::allocator<wasm::Expression_*>::~allocator(&local_139);
  return;
}

Assistant:

void visitUnary(Unary* curr) {
    Name functionCall;
    switch (curr->op) {
      case NearestFloat32:
        functionCall = WASM_NEAREST_F32;
        break;
      case NearestFloat64:
        functionCall = WASM_NEAREST_F64;
        break;

      case PopcntInt64:
        functionCall = WASM_POPCNT64;
        break;
      case PopcntInt32:
        functionCall = WASM_POPCNT32;
        break;

      case CtzInt64:
        functionCall = WASM_CTZ64;
        break;
      case CtzInt32:
        functionCall = WASM_CTZ32;
        break;

      default:
        return;
    }
    neededIntrinsics.insert(functionCall);
    replaceCurrent(builder->makeCall(functionCall, {curr->value}, curr->type));
  }